

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

int scale_expansion_zeroelim(int elen,double *e,double b,double *h)

{
  double dVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar1 = splitter;
  dVar6 = splitter * b - (splitter * b - b);
  dVar7 = b - dVar6;
  dVar8 = *e;
  dVar5 = dVar8 * b;
  dVar9 = splitter * dVar8 - (splitter * dVar8 - dVar8);
  dVar8 = (dVar8 - dVar9) * dVar7 -
          (((dVar5 - dVar9 * dVar6) - (dVar8 - dVar9) * dVar6) - dVar9 * dVar7);
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    *h = dVar8;
    iVar2 = 1;
  }
  else {
    iVar2 = 0;
  }
  if (1 < elen) {
    uVar3 = 1;
    do {
      dVar8 = e[uVar3];
      dVar9 = dVar8 * b;
      dVar10 = dVar1 * dVar8 - (dVar1 * dVar8 - dVar8);
      dVar8 = (dVar8 - dVar10) * dVar7 -
              (((dVar9 - dVar10 * dVar6) - (dVar8 - dVar10) * dVar6) - dVar10 * dVar7);
      dVar10 = dVar5 + dVar8;
      dVar8 = (dVar5 - (dVar10 - (dVar10 - dVar5))) + (dVar8 - (dVar10 - dVar5));
      if ((dVar8 != 0.0) || (NAN(dVar8))) {
        lVar4 = (long)iVar2;
        iVar2 = iVar2 + 1;
        h[lVar4] = dVar8;
      }
      dVar5 = dVar9 + dVar10;
      dVar10 = dVar10 - (dVar5 - dVar9);
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        lVar4 = (long)iVar2;
        iVar2 = iVar2 + 1;
        h[lVar4] = dVar10;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)elen != uVar3);
  }
  if (((dVar5 == 0.0) && (!NAN(dVar5))) && (iVar2 != 0)) {
    return iVar2;
  }
  h[iVar2] = dVar5;
  return iVar2 + 1;
}

Assistant:

int scale_expansion_zeroelim(int elen, REAL *e, REAL b, REAL *h)
/* e and h cannot be the same. */
{
  INEXACT REAL Q, sum;
  REAL hh;
  INEXACT REAL product1;
  REAL product0;
  int eindex, hindex;
  REAL enow;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;

  Split(b, bhi, blo);
  Two_Product_Presplit(e[0], b, bhi, blo, Q, hh);
  hindex = 0;
  if (hh != 0) {
    h[hindex++] = hh;
  }
  for (eindex = 1; eindex < elen; eindex++) {
    enow = e[eindex];
    Two_Product_Presplit(enow, b, bhi, blo, product1, product0);
    Two_Sum(Q, product0, sum, hh);
    if (hh != 0) {
      h[hindex++] = hh;
    }
    Fast_Two_Sum(product1, sum, Q, hh);
    if (hh != 0) {
      h[hindex++] = hh;
    }
  }
  if ((Q != 0.0) || (hindex == 0)) {
    h[hindex++] = Q;
  }
  return hindex;
}